

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_primitive_createPointerType
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  uint uVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  ulong uVar4;
  sysbvm_tuple_t *arguments_00;
  anon_struct_72_9_b7d77bac gcFrame;
  sysbvm_tuple_t local_98;
  sysbvm_tuple_t sStack_90;
  sysbvm_tuple_t local_88;
  sysbvm_object_tuple_t *psStack_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_tuple_t local_58;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  sysbvm_tuple_t local_28;
  sysbvm_tuple_t sStack_20;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  uVar4 = *arguments;
  local_98 = arguments[1];
  sStack_90 = arguments[2];
  local_68 = 0;
  sStack_60 = 0;
  local_78 = 0;
  sStack_70 = 0;
  local_88 = 0;
  psStack_80 = (sysbvm_object_tuple_t *)0x0;
  local_58 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 9;
  puStack_30 = (undefined1 *)&local_98;
  sysbvm_stackFrame_pushRecord(&local_48);
  if (sStack_90 == 0) {
    sysbvm_error("Expected a valid address space for pointer type.");
  }
  psStack_80 = sysbvm_context_allocatePointerTuple(context,(context->roots).pointerType,0x21);
  if (((uVar4 & 0xf) == 0 && uVar4 != 0) && (0xf < *(uint *)(uVar4 + 0xc))) {
    *(sysbvm_object_tuple_t **)(uVar4 + 0x18) = psStack_80;
  }
  psStack_80[4].field_1.pointers[0] = 0x291b;
  psStack_80[3].field_1.pointers[0] = 0xb;
  sVar3 = sysbvm_array_create(context,0);
  psStack_80[2].header.identityHashAndFlags = (int)sVar3;
  psStack_80[2].header.objectSize = (int)(sVar3 >> 0x20);
  psStack_80[2].header.field_0 =
       (anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0)(context->roots).anyPointerType;
  uVar1 = context->targetWordSize;
  uVar4 = (ulong)uVar1 << 4 | 0xb;
  psStack_80[4].header.identityHashAndFlags = (int)uVar4;
  psStack_80[4].header.objectSize = (int)(uVar4 >> 0x20);
  _Var2 = sysbvm_tuple_isKindOf(context,sStack_90,(context->roots).memberAddressSpaceType);
  psStack_80[4].header.field_0.typePointer = ((ulong)uVar1 << _Var2) << 4 | 0xb;
  psStack_80[10].header.identityHashAndFlags = (undefined4)local_98;
  psStack_80[10].header.objectSize = local_98._4_4_;
  psStack_80[10].field_1.pointers[0] = sStack_90;
  local_78 = sysbvm_pointerLikeType_createPointerLikeStoreFunction
                       (context,(sysbvm_tuple_t)psStack_80,local_98,0);
  psStack_80[0xb].header.identityHashAndFlags = (int)local_78;
  psStack_80[0xb].header.objectSize = (int)(local_78 >> 0x20);
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)psStack_80,(context->roots).storeSelector,local_78);
  sStack_70 = sysbvm_pointerLikeType_createPointerLikeLoadFunction
                        (context,(sysbvm_tuple_t)psStack_80,local_98,0);
  psStack_80[0xb].header.field_0.typePointer = sStack_70;
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)psStack_80,(context->roots).loadSelector,sStack_70);
  arguments_00 = &local_28;
  local_28 = local_98;
  sStack_20 = sStack_90;
  local_88 = sysbvm_function_apply(context,(context->roots).referenceTypeTemplate,2,arguments_00,0);
  sVar3 = sysbvm_pointerLikeType_createPointerLikeReinterpretCast
                    (context,(sysbvm_tuple_t)psStack_80,local_88,(sysbvm_bitflags_t)arguments_00);
  local_58 = sVar3;
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)psStack_80,(context->roots).underscoreSelector,sVar3);
  sVar3 = sysbvm_pointerLikeType_createAddition
                    (context,(sysbvm_tuple_t)psStack_80,(sysbvm_tuple_t)psStack_80,sVar3);
  local_68 = sVar3;
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)psStack_80,(context->roots).plusSelector,sVar3);
  sStack_60 = sysbvm_pointerLikeType_createAddition
                        (context,(sysbvm_tuple_t)psStack_80,local_88,sVar3);
  sysbvm_type_setMethodWithSelector
            (context,(sysbvm_tuple_t)psStack_80,(context->roots).subscriptSelector,sStack_60);
  sysbvm_stackFrame_popRecord(&local_48);
  return (sysbvm_tuple_t)psStack_80;
}

Assistant:

static sysbvm_tuple_t sysbvm_type_primitive_createPointerType(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    return sysbvm_type_doCreatePointerType(context, arguments[0], arguments[1], arguments[2]);
}